

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

Extrapolation anon_unknown.dwarf_104fe::getExtrapolation(string *str)

{
  int iVar1;
  ostream *poVar2;
  invalid_argument *this;
  Extrapolation EVar3;
  stringstream e;
  string local_1c0 [32];
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  iVar1 = std::__cxx11::string::compare((char *)str);
  EVar3 = BLACK;
  if (iVar1 != 0) {
    iVar1 = std::__cxx11::string::compare((char *)str);
    EVar3 = BLACK;
    if (iVar1 != 0) {
      iVar1 = std::__cxx11::string::compare((char *)str);
      EVar3 = CLAMP;
      if (iVar1 != 0) {
        iVar1 = std::__cxx11::string::compare((char *)str);
        if (iVar1 != 0) {
          iVar1 = std::__cxx11::string::compare((char *)str);
          EVar3 = PERIODIC;
          if (iVar1 != 0) {
            iVar1 = std::__cxx11::string::compare((char *)str);
            if (iVar1 != 0) {
              iVar1 = std::__cxx11::string::compare((char *)str);
              EVar3 = MIRROR;
              if (iVar1 != 0) {
                iVar1 = std::__cxx11::string::compare((char *)str);
                if (iVar1 != 0) {
                  std::__cxx11::stringstream::stringstream(local_1a0);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (local_190,"Unknown extrapolation method \"",0x1e);
                  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                                     (local_190,(str->_M_dataplus)._M_p,str->_M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\"",1);
                  this = (invalid_argument *)__cxa_allocate_exception(0x10);
                  std::__cxx11::stringbuf::str();
                  std::invalid_argument::invalid_argument(this,local_1c0);
                  __cxa_throw(this,&std::invalid_argument::typeinfo,
                              std::invalid_argument::~invalid_argument);
                }
              }
            }
          }
        }
      }
    }
  }
  return EVar3;
}

Assistant:

Extrapolation
getExtrapolation (const string& str)
{
    Extrapolation e;

    if (str == "black" || str == "BLACK") { e = BLACK; }
    else if (str == "clamp" || str == "CLAMP") { e = CLAMP; }
    else if (str == "periodic" || str == "PERIODIC") { e = PERIODIC; }
    else if (str == "mirror" || str == "MIRROR") { e = MIRROR; }
    else
    {
        std::stringstream e;
        e << "Unknown extrapolation method \"" << str << "\"";
        throw invalid_argument (e.str ());
    }

    return e;
}